

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>>::
initialize<tinyusdz::Animatable<tinyusdz::value::matrix4d>>
          (optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>> *this,
          Animatable<tinyusdz::value::matrix4d> *value)

{
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>>)0x1) {
    memcpy(this + 8,value,0x82);
    *(pointer *)(this + 0x90) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x98) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0xa0) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this[0xa8] = (optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>>)(value->_ts)._dirty;
    *this = (optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::value::matrix4d>, V = tinyusdz::Animatable<tinyusdz::value::matrix4d>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }